

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  result x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<Parser::result,_std::allocator<Parser::result>_> newLexRes;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  long *local_188;
  long local_180;
  long local_178 [2];
  long *local_168;
  long local_160;
  long local_158 [2];
  string local_148;
  vector<Parser::result,_std::allocator<Parser::result>_> local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_148);
  Lexer::goLex(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0.field_2._8_8_ = plVar1[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Lexer::print(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&Parser::lineRec,
             (vector<int,_std::allocator<int>_> *)&Lexer::lineRec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Parser::endTran_abi_cxx11_,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)Lexer::endTran_abi_cxx11_);
  plVar1 = DAT_00127240;
  local_128.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<Parser::result,_std::allocator<Parser::result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (Lexer::LexRes != DAT_00127240) {
    plVar3 = Lexer::LexRes;
    do {
      local_1a8 = local_198;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,*plVar3,plVar3[1] + *plVar3);
      local_188 = local_178;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,plVar3[4],plVar3[5] + plVar3[4]);
      local_168 = local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,plVar3[8],plVar3[9] + plVar3[8]);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_1a8,local_1a0 + (long)local_1a8);
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_188,local_180 + (long)local_188);
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_168,local_160 + (long)local_168);
      std::vector<Parser::result,_std::allocator<Parser::result>_>::emplace_back<Parser::result>
                (&local_128,(result *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      }
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      if (local_188 != local_178) {
        operator_delete(local_188,local_178[0] + 1);
      }
      if (local_1a8 != local_198) {
        operator_delete(local_1a8,local_198[0] + 1);
      }
      plVar3 = plVar3 + 0xc;
    } while (plVar3 != plVar1);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  Parser::init((EVP_PKEY_CTX *)&local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  Parser::goParser(&local_128);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_8_ = plVar1[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Parser::printFile(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = plVar1[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_f0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Parser::printVariable(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,prefix_abi_cxx11_._M_dataplus._M_p,
             prefix_abi_cxx11_._M_dataplus._M_p + prefix_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_8_ = plVar1[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_110._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  Parser::printLine(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::vector<Parser::result,_std::allocator<Parser::result>_>::~vector(&local_128);
  return 0;
}

Assistant:

int main(){
	//freopen(prefix + "tmp.txt","w",stdout);
	Lexer::goLex(prefix+"test.txt");
	Lexer::print(prefix+"result/"+"lexer.txt");
	Parser::lineRec = Lexer::lineRec;
	Parser::endTran = Lexer::endTran;
	vector<Parser::result> newLexRes;
	for(auto x : Lexer::LexRes){
		newLexRes.push_back((Parser::result){x.type , x.name , x.value});
	} 
	Parser::init(prefix+"generator.txt");
	Parser::goParser(newLexRes);

	Parser::printFile(prefix+"result/"+"parser.txt");

	Parser::printVariable(prefix+"result/"+"Variable.txt");
	Parser::printLine(prefix+"result/"+"Line.txt");
	return 0;
}